

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall cmComputeLinkInformation::AddLinkPrefix(cmComputeLinkInformation *this,char *p)

{
  allocator local_39;
  value_type local_38;
  char *local_18;
  char *p_local;
  cmComputeLinkInformation *this_local;
  
  if ((p != (char *)0x0) && (*p != '\0')) {
    local_18 = p;
    p_local = (char *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,p,&local_39);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->LinkPrefixes,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddLinkPrefix(const char* p)
{
  if (p && *p) {
    this->LinkPrefixes.insert(p);
  }
}